

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::
rangeToString<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,double>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,double>>>
          (string *__return_storage_ptr__,Detail *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                last)

{
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50 [32];
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  std::operator<<(RStack_68.m_oss,"{ ");
  if ((_Base_ptr)this != first._M_node) {
    std::__cxx11::string::string(local_50,(string *)unprintableString_abi_cxx11_);
    std::operator<<(RStack_68.m_oss,local_50);
    std::__cxx11::string::~string(local_50);
    while( true ) {
      this = (Detail *)std::_Rb_tree_increment((_Rb_tree_node_base *)this);
      if ((_Base_ptr)this == first._M_node) break;
      std::operator<<(RStack_68.m_oss,", ");
      std::__cxx11::string::string(local_50,(string *)unprintableString_abi_cxx11_);
      std::operator<<(RStack_68.m_oss,local_50);
      std::__cxx11::string::~string(local_50);
    }
  }
  std::operator<<(RStack_68.m_oss," }");
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&RStack_68);
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }